

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

void __thiscall HydEngine::initMatrixSolver(HydEngine *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *extraout_RDX;
  char *__to;
  char *__to_00;
  char *extraout_RDX_00;
  ulong uVar4;
  ulong uVar5;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> node1;
  vector<int,_std::allocator<int>_> node2;
  
  uVar1 = Network::count(this->network,NODE);
  uVar2 = Network::count(this->network,LINK);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)(int)uVar2,
             (allocator_type *)
             &node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)(int)uVar2,
             (allocator_type *)
             ((long)&node2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = 0;
  uVar5 = 0;
  __to = extraout_RDX;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = Network::link(this->network,(char *)(uVar4 & 0xffffffff),__to);
    *(int *)((long)local_68 + uVar4 * 4) =
         *(int *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x30) + 0x28);
    iVar3 = Network::link(this->network,(char *)(uVar4 & 0xffffffff),__to_00);
    node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[uVar4] = *(int *)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x38) + 0x28);
    __to = extraout_RDX_00;
  }
  (*this->matrixSolver->_vptr_MatrixSolver[2])
            (this->matrixSolver,(ulong)uVar1,(ulong)uVar2,local_68,
             node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_68);
  return;
}

Assistant:

void HydEngine::initMatrixSolver()
{
    int nodeCount = network->count(Element::NODE);
    int linkCount = network->count(Element::LINK);
    try
    {
        // ... place the start/end node indexes of each network link in arrays

        vector<int> node1(linkCount);
        vector<int> node2(linkCount);
        for (int k = 0; k < linkCount; k++)
        {
            node1[k] = network->link(k)->fromNode->index;
            node2[k] = network->link(k)->toNode->index;
        }

        // ...  initialize the matrix solver

        matrixSolver->init(nodeCount, linkCount, (int *)&node1[0], (int *)&node2[0]);
    }
    catch (...)
    {
        throw;
    }
}